

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O0

bool __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
::is_non_zero(Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
              *this,ID_index rowIndex)

{
  bool bVar1;
  ID_index IVar2;
  reference this_00;
  Entry *entry;
  const_iterator __end0;
  const_iterator __begin0;
  Column_support *__range2;
  ID_index rowIndex_local;
  Intrusive_list_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  *this_local;
  
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
  ::begin((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
           *)&__end0);
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
  ::end((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
         *)&entry);
  while( true ) {
    bVar1 = boost::intrusive::operator!=
                      (&__end0,(list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_column_tag,_1U>,_true>
                                *)&entry);
    if (!bVar1) {
      return false;
    }
    this_00 = boost::intrusive::
              list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_column_tag,_1U>,_true>
              ::operator*(&__end0);
    IVar2 = Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
            ::get_row_index(this_00);
    if (IVar2 == rowIndex) break;
    boost::intrusive::
    list_iterator<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>::Matrix_column_tag,_1U>,_true>
    ::operator++(&__end0);
  }
  return true;
}

Assistant:

inline bool Intrusive_list_column<Master_matrix>::is_non_zero(ID_index rowIndex) const
{
  // could be changed to dichotomic search as column is ordered by row index,
  // but I am not sure if it is really worth it as there is no random access
  // and the columns should not be that long anyway.
  for (const Entry& entry : column_)
    if (entry.get_row_index() == rowIndex) return true;

  return false;
}